

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interfaces.cpp
# Opt level: O3

void __thiscall wallet::anon_unknown_5::WalletLoaderImpl::~WalletLoaderImpl(WalletLoaderImpl *this)

{
  long lVar1;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  (this->super_WalletLoader).super_ChainClient._vptr_ChainClient =
       (_func_int **)&PTR__WalletLoaderImpl_013b9c10;
  UnloadWallets(&this->m_context);
  _GLOBAL__N_1::std::__cxx11::_List_base<CRPCCommand,_std::allocator<CRPCCommand>_>::_M_clear
            (&(this->m_rpc_commands).super__List_base<CRPCCommand,_std::allocator<CRPCCommand>_>);
  _GLOBAL__N_1::std::
  vector<std::unique_ptr<interfaces::Handler,_std::default_delete<interfaces::Handler>_>,_std::allocator<std::unique_ptr<interfaces::Handler,_std::default_delete<interfaces::Handler>_>_>_>
  ::~vector(&this->m_rpc_handlers);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&this->m_wallet_filenames);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    WalletContext::~WalletContext(&this->m_context);
    return;
  }
  __stack_chk_fail();
}

Assistant:

void registerRpcs() override
    {
        for (const CRPCCommand& command : GetWalletRPCCommands()) {
            m_rpc_commands.emplace_back(command.category, command.name, [this, &command](const JSONRPCRequest& request, UniValue& result, bool last_handler) {
                JSONRPCRequest wallet_request = request;
                wallet_request.context = &m_context;
                return command.actor(wallet_request, result, last_handler);
            }, command.argNames, command.unique_id);
            m_rpc_handlers.emplace_back(m_context.chain->handleRpc(m_rpc_commands.back()));
        }
    }